

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O1

SquareMatrix<3> *
pbrt::ConvertRGBColorSpace
          (SquareMatrix<3> *__return_storage_ptr__,RGBColorSpace *from,RGBColorSpace *to)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int i;
  long lVar5;
  Float (*paFVar6) [3];
  SquareMatrix<3> *pSVar7;
  long lVar8;
  SquareMatrix<3> *pSVar9;
  int k;
  long lVar10;
  SquareMatrix<3> *pSVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  bVar4 = RGBColorSpace::operator==(from,to);
  if (bVar4) {
    lVar5 = 0;
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    paFVar6 = (Float (*) [3])__return_storage_ptr__;
    do {
      auVar14 = vpbroadcastq_avx512f();
      uVar1 = vpcmpeqq_avx512f(auVar14,auVar12);
      uVar2 = vpcmpeqq_avx512f(auVar14,auVar13);
      auVar14 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
      auVar14 = vpsrld_avx512f(auVar14,0x1f);
      auVar14 = vcvtdq2ps_avx512f(auVar14);
      auVar15._0_12_ = auVar14._0_12_;
      auVar15._12_4_ = paFVar6[1][0];
      auVar15._16_4_ = paFVar6[1][1];
      auVar15._20_4_ = paFVar6[1][2];
      auVar15._24_4_ = paFVar6[2][0];
      auVar15._28_4_ = paFVar6[2][1];
      auVar15._32_4_ = paFVar6[2][2];
      auVar15._36_4_ = ((SquareMatrix<3> *)(paFVar6 + 3))->m[0][0];
      auVar15._40_4_ = ((SquareMatrix<3> *)(paFVar6 + 3))->m[0][1];
      auVar15._44_4_ = ((SquareMatrix<3> *)(paFVar6 + 3))->m[0][2];
      auVar15._48_4_ = paFVar6[4][0];
      auVar15._52_4_ = paFVar6[4][1];
      auVar15._56_4_ = paFVar6[4][2];
      auVar15._60_4_ = paFVar6[5][0];
      *(undefined1 (*) [64])paFVar6 = auVar15;
      lVar5 = lVar5 + 1;
      paFVar6 = paFVar6 + 1;
    } while (lVar5 != 3);
  }
  else {
    pSVar11 = &to->RGBFromXYZ;
    lVar5 = 0;
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    paFVar6 = (Float (*) [3])__return_storage_ptr__;
    do {
      auVar14 = vpbroadcastq_avx512f();
      uVar1 = vpcmpeqq_avx512f(auVar14,auVar12);
      uVar2 = vpcmpeqq_avx512f(auVar14,auVar13);
      auVar14 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
      auVar14 = vpsrld_avx512f(auVar14,0x1f);
      auVar14 = vcvtdq2ps_avx512f(auVar14);
      auVar14._12_4_ = paFVar6[1][0];
      auVar14._16_4_ = paFVar6[1][1];
      auVar14._20_4_ = paFVar6[1][2];
      auVar14._24_4_ = paFVar6[2][0];
      auVar14._28_4_ = paFVar6[2][1];
      auVar14._32_4_ = paFVar6[2][2];
      auVar14._36_4_ = ((SquareMatrix<3> *)(paFVar6 + 3))->m[0][0];
      auVar14._40_4_ = ((SquareMatrix<3> *)(paFVar6 + 3))->m[0][1];
      auVar14._44_4_ = ((SquareMatrix<3> *)(paFVar6 + 3))->m[0][2];
      auVar14._48_4_ = paFVar6[4][0];
      auVar14._52_4_ = paFVar6[4][1];
      auVar14._56_4_ = paFVar6[4][2];
      auVar14._60_4_ = paFVar6[5][0];
      *(undefined1 (*) [64])paFVar6 = auVar14;
      lVar5 = lVar5 + 1;
      paFVar6 = paFVar6 + 1;
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      lVar8 = 0;
      pSVar7 = &from->XYZFromRGB;
      do {
        __return_storage_ptr__->m[lVar5][lVar8] = 0.0;
        auVar12 = ZEXT1664((undefined1  [16])0x0);
        lVar10 = 0;
        pSVar9 = pSVar7;
        do {
          auVar3 = vfmadd231ss_fma(auVar12._0_16_,ZEXT416((uint)pSVar11->m[0][lVar10]),
                                   ZEXT416((uint)pSVar9->m[0][0]));
          auVar12 = ZEXT1664(auVar3);
          lVar10 = lVar10 + 1;
          pSVar9 = (SquareMatrix<3> *)(pSVar9->m + 1);
        } while (lVar10 != 3);
        __return_storage_ptr__->m[lVar5][lVar8] = auVar3._0_4_;
        lVar8 = lVar8 + 1;
        pSVar7 = (SquareMatrix<3> *)(pSVar7->m[0] + 1);
      } while (lVar8 != 3);
      lVar5 = lVar5 + 1;
      pSVar11 = (SquareMatrix<3> *)(pSVar11->m + 1);
    } while (lVar5 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix<3> ConvertRGBColorSpace(const RGBColorSpace &from, const RGBColorSpace &to) {
    if (from == to)
        return {};
    return to.RGBFromXYZ * from.XYZFromRGB;
}